

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O2

void __thiscall
EDLines::SplitSegment2Lines(EDLines *this,double *x,double *y,int noPixels,int segmentNo)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double a;
  double b;
  int lastInvert;
  double local_108;
  int local_fc;
  double local_f8;
  double *local_f0;
  double lastA;
  double local_e0;
  double local_d8;
  double lastB;
  int local_c4;
  EDLines *local_c0;
  ulong local_b8;
  long local_b0;
  vector<LineSegment,_std::allocator<LineSegment>_> *local_a8;
  double ey;
  double ex;
  double sy;
  double sx;
  double error;
  LineSegment local_78;
  
  local_a8 = &this->lines;
  local_fc = 0;
  local_c4 = segmentNo;
  do {
    iVar1 = this->min_line_len;
    if (noPixels < iVar1) {
      return;
    }
    local_b8 = (ulong)(1 - local_fc);
    local_fc = -local_fc;
    lVar4 = (long)noPixels;
    while( true ) {
      iVar3 = (int)lVar4;
      if (iVar3 < iVar1) {
        return;
      }
      LineFit(x,y,iVar1,&lastA,&lastB,&error,&lastInvert);
      iVar1 = lastInvert;
      if (error <= 0.5) break;
      x = x + 1;
      y = y + 1;
      iVar1 = this->min_line_len;
      local_fc = local_fc + -1;
      local_b8 = local_b8 - 1;
      lVar4 = lVar4 + -1;
    }
    dVar10 = (double)(ulong)(uint)this->min_line_len;
    local_d8 = this->line_error;
    local_f8 = dVar10;
    local_f0 = x;
    local_c0 = this;
    do {
      b = lastB;
      a = lastA;
      iVar8 = SUB84(dVar10,0);
      this = local_c0;
      if (iVar3 <= iVar8) goto LAB_00115710;
      iVar6 = iVar8 + -1;
      iVar7 = 0;
      iVar9 = 0;
      local_108 = dVar10;
      for (lVar5 = (long)iVar8; lVar5 < lVar4; lVar5 = lVar5 + 1) {
        dVar10 = ComputeMinDistance(local_f0[lVar5],y[lVar5],a,b,iVar1);
        if (dVar10 <= local_d8) {
          iVar7 = iVar7 + 1;
          iVar9 = 0;
          iVar6 = (int)lVar5;
        }
        else {
          if (3 < iVar9) break;
          iVar9 = iVar9 + 1;
        }
      }
      x = local_f0;
      if (iVar7 < 2) break;
      uVar2 = (SUB84(local_f8,0) - local_108._0_4_) + iVar6 + 1;
      local_f8 = (double)(ulong)uVar2;
      LineFit(local_f0,y,uVar2,&lastA,&lastB,iVar1);
      dVar10 = (double)(ulong)(iVar6 + 1U);
      a = lastA;
      b = lastB;
    } while ((int)(iVar6 + 1U) < iVar3);
    lVar4 = 0;
    do {
      lVar5 = lVar4;
      local_108 = x[lVar5];
      local_e0 = y[lVar5];
      dVar10 = ComputeMinDistance(local_108,local_e0,a,b,iVar1);
      lVar4 = lVar5 + 1;
    } while (local_d8 < dVar10);
    local_b0 = lVar5 + 1;
    ComputeClosestPoint(local_108,local_e0,a,b,iVar1,&sx,&sy);
    lVar4 = (long)iVar6;
    uVar2 = iVar6 + 2;
    iVar8 = uVar2 - (int)lVar5;
    do {
      local_108 = x[lVar4];
      local_e0 = y[lVar4];
      dVar10 = ComputeMinDistance(local_108,local_e0,a,b,iVar1);
      lVar4 = lVar4 + -1;
      iVar8 = iVar8 + -1;
      uVar2 = uVar2 - 1;
    } while (local_d8 < dVar10);
    ComputeClosestPoint(local_108,local_e0,a,b,iVar1,&ex,&ey);
    this = local_c0;
    if ((sx != ex) || (NAN(sx) || NAN(ex))) {
LAB_00115672:
      local_78.firstPixelIndex = (int)local_b0 - (int)local_b8;
      local_78.invert = iVar1;
      local_78.sx = sx;
      local_78.sy = sy;
      local_78.ex = ex;
      local_78.ey = ey;
      local_78.segmentNo = local_c4;
      local_78.len = iVar8;
      std::vector<LineSegment,_std::allocator<LineSegment>_>::emplace_back<LineSegment>
                (local_a8,&local_78);
      this->linesNo = this->linesNo + 1;
      local_f8 = (double)(ulong)uVar2;
      x = local_f0;
    }
    else if ((sy != ey) || (x = local_f0, NAN(sy) || NAN(ey))) goto LAB_00115672;
LAB_00115710:
    iVar1 = SUB84(local_f8,0);
    noPixels = iVar3 - iVar1;
    x = x + iVar1;
    y = y + iVar1;
    local_fc = iVar1 - local_fc;
  } while( true );
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo)
{

	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				if ((sx == ex) & (sy == ey))
					break;

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}